

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::yml::Parser::_handle_key_anchors_and_refs(Parser *this)

{
  char *pcVar1;
  code *pcVar2;
  char *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  csubstr s;
  bool bVar7;
  undefined1 uVar8;
  State *pSVar9;
  size_t sVar10;
  undefined8 extraout_RAX;
  csubstr rem;
  char msg [31];
  basic_substring<const_char> local_f8;
  basic_substring<const_char> local_e8;
  undefined6 uStack_d8;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  undefined6 uStack_d0;
  undefined1 uStack_ca;
  undefined1 uStack_c9;
  char acStack_c8 [40];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  char *pcStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  char *local_28;
  size_t sStack_20;
  
  pSVar9 = this->m_state;
  if ((pSVar9->flags & 0x80) != 0) {
    uStack_d8 = 0x6e615f736168;
    uStack_d2 = 0x79;
    uStack_d1 = 0x28;
    uStack_d0 = 0x29294c415652;
    uStack_ca = 0;
    local_e8.str = (char *)0x6166206b63656863;
    local_e8.len._0_6_ = 0x203a64656c69;
    local_e8.len._6_1_ = 0x28;
    local_e8.len._7_1_ = 0x21;
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar2 = (code *)swi(3);
      uVar8 = (*pcVar2)();
      return (bool)uVar8;
    }
    local_78 = 0;
    uStack_70 = 0x7185;
    local_68 = 0;
    pcStack_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_58 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7185) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x7185) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_e8,0x1f,LVar4,(this->m_stack).m_callbacks.m_user_data);
    pSVar9 = this->m_state;
  }
  pcVar3 = (pSVar9->line_contents).rem.str;
  local_f8.len = (pSVar9->line_contents).rem.len;
  if (local_f8.len != 0) {
    local_f8.str = pcVar3;
    if (*pcVar3 == '&') {
      if ((~pSVar9->flags & 0x220U) == 0) {
        if ((pSVar9->flags & 0x40U) == 0) {
          uStack_d8 = 0x796e615f7361;
          uStack_d2 = 0x28;
          uStack_d1 = 0x52;
          uStack_d0 = 0x292959454b;
          local_e8.str = (char *)0x6166206b63656863;
          local_e8.len._0_6_ = 0x203a64656c69;
          local_e8.len._6_1_ = 0x28;
          local_e8.len._7_1_ = 0x68;
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            uVar8 = (*pcVar2)();
            return (bool)uVar8;
          }
          local_a0 = 0;
          uStack_98 = 0x718c;
          local_90 = 0;
          pcStack_88 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_80 = 0x65;
          LVar5.super_LineCol.col = 0;
          LVar5.super_LineCol.offset = SUB168(ZEXT816(0x718c) << 0x40,0);
          LVar5.super_LineCol.line = SUB168(ZEXT816(0x718c) << 0x40,8);
          LVar5.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          LVar5.name.len = 0x65;
          (*(this->m_stack).m_callbacks.m_error)
                    ((char *)&local_e8,0x1e,LVar5,(this->m_stack).m_callbacks.m_user_data);
        }
        pcVar1 = (this->m_buf).str;
        if ((pcVar3 + -1 < pcVar1) || (pcVar1 + (this->m_buf).len < pcVar3 + -1)) {
          builtin_strncpy(acStack_c8 + 0x10,"buf.end())",0xb);
          builtin_strncpy(acStack_c8,"n() && str <= m_",0x10);
          uStack_d8 = 0x203d3e207274;
          uStack_d2 = 0x6d;
          uStack_d1 = 0x5f;
          uStack_d0 = 0x65622e667562;
          uStack_ca = 0x67;
          uStack_c9 = 0x69;
          local_e8.str = (char *)0x6166206b63656863;
          local_e8.len._0_6_ = 0x203a64656c69;
          local_e8.len._6_1_ = 0x28;
          local_e8.len._7_1_ = 0x73;
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            uVar8 = (*pcVar2)();
            return (bool)uVar8;
          }
          local_50 = 0;
          uStack_48 = 0x5e96;
          local_40 = 0;
          pcStack_38 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_30 = 0x65;
          LVar6.super_LineCol.col = 0;
          LVar6.super_LineCol.offset = SUB168(ZEXT816(0x5e96) << 0x40,0);
          LVar6.super_LineCol.line = SUB168(ZEXT816(0x5e96) << 0x40,8);
          LVar6.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          LVar6.name.len = 0x65;
          (*(this->m_stack).m_callbacks.m_error)
                    ((char *)&local_e8,0x3b,LVar6,(this->m_stack).m_callbacks.m_user_data);
        }
        _append_key_val(this,(csubstr)ZEXT816(0),0);
        this->m_state->flags = this->m_state->flags & 0xffffffdf;
      }
      else {
        sVar10 = basic_substring<const_char>::first_of(&local_f8,' ',0);
        if ((sVar10 != 0xffffffffffffffff) && (local_f8.len < sVar10)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            uVar8 = (*pcVar2)();
            return (bool)uVar8;
          }
          handle_error(0x1f8007,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1569,"pos <= len || pos == npos");
        }
        if (sVar10 == 0xffffffffffffffff) {
          local_e8.str = local_f8.str;
          local_e8.len._0_6_ = (undefined6)local_f8.len;
          local_e8.len._6_1_ = (undefined1)(local_f8.len >> 0x30);
          local_e8.len._7_1_ = (undefined1)(local_f8.len >> 0x38);
        }
        else {
          basic_substring<const_char>::basic_substring(&local_e8,local_f8.str,sVar10);
        }
        pcVar3 = local_e8.str;
        sVar10 = CONCAT17(local_e8.len._7_1_,CONCAT16(local_e8.len._6_1_,(undefined6)local_e8.len));
        _line_progressed(this,sVar10);
        if (sVar10 == 0) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            uVar8 = (*pcVar2)();
            return (bool)uVar8;
          }
          handle_error(0x1f8007,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring(&local_e8,pcVar3 + 1,sVar10 - 1);
        sStack_20 = CONCAT17(local_e8.len._7_1_,
                             CONCAT16(local_e8.len._6_1_,(undefined6)local_e8.len));
        local_28 = local_e8.str;
        _move_key_anchor_to_val_anchor(this);
        (this->m_key_anchor).str = local_28;
        (this->m_key_anchor).len = sStack_20;
        s.len = local_f8.len;
        s.str = local_f8.str;
        sVar10 = LineContents::current_col(&this->m_state->line_contents,s);
        this->m_key_anchor_indentation = sVar10;
      }
      return true;
    }
    if (*pcVar3 == '*') {
      _handle_key_anchors_and_refs(this);
      __clang_call_terminate(extraout_RAX);
    }
  }
  return false;
}

Assistant:

bool Parser::_handle_key_anchors_and_refs()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, !has_any(RVAL));
    const csubstr rem = m_state->line_contents.rem;
    if(rem.begins_with('&'))
    {
        _c4dbgp("found a key anchor!!!");
        if(has_all(QMRK|SSCL))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_any(RKEY));
            _c4dbgp("there is a stored key, so this anchor is for the next element");
            _append_key_val_null(rem.str - 1);
            rem_flags(QMRK);
            return true;
        }
        csubstr anchor = rem.left_of(rem.first_of(' '));
        _line_progressed(anchor.len);
        anchor = anchor.sub(1); // skip the first character
        _move_key_anchor_to_val_anchor();
        _c4dbgpf("key anchor value: '{}'", anchor);
        m_key_anchor = anchor;
        m_key_anchor_indentation = m_state->line_contents.current_col(rem);
        return true;
    }
    else if(C4_UNLIKELY(rem.begins_with('*')))
    {
        _c4err("not implemented - this should have been catched elsewhere");
        C4_NEVER_REACH();
        return false;
    }
    return false;
}